

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pnm_test(stbi__context *s)

{
  stbi_uc *psVar1;
  bool bVar2;
  bool bVar3;
  
  psVar1 = s->img_buffer;
  if (psVar1 < s->img_buffer_end) {
LAB_0011374d:
    s->img_buffer = psVar1 + 1;
    bVar3 = *psVar1 != 'P';
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar1 = s->img_buffer;
      goto LAB_0011374d;
    }
    bVar3 = true;
  }
  psVar1 = s->img_buffer;
  if (s->img_buffer_end <= psVar1) {
    if (s->read_from_callbacks == 0) {
      bVar2 = true;
      goto LAB_00113798;
    }
    stbi__refill_buffer(s);
    psVar1 = s->img_buffer;
  }
  s->img_buffer = psVar1 + 1;
  bVar2 = (byte)(*psVar1 - 0x37) < 0xfe;
LAB_00113798:
  if ((bool)(bVar3 | bVar2)) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  return (uint)!(bool)(bVar3 | bVar2);
}

Assistant:

static int      stbi__pnm_test(stbi__context *s)
{
   char p, t;
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind( s );
       return 0;
   }
   return 1;
}